

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

int grapg_5_3::dijkstra_1(m_graph g,int v)

{
  ulong uVar1;
  undefined4 *puVar2;
  int iVar3;
  undefined4 *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int j;
  ulong uVar8;
  ulong uStack_20;
  
  uVar1 = (ulong)(uint)g.vnum;
  uVar5 = uVar1 * 4 + 0xf & 0xfffffffffffffff0;
  puVar2 = (undefined4 *)(&stack0xffffffffffffffe8 + -uVar5);
  puVar4 = (undefined4 *)((long)puVar2 - uVar5);
  uVar5 = 0;
  uVar6 = 0;
  if (0 < g.vnum) {
    uVar6 = (ulong)(uint)g.vnum;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    puVar2[uVar5] = g.arc[v][uVar5];
    puVar4[uVar5] = 0;
  }
  *puVar4 = 1;
  *puVar2 = 0;
  *(undefined8 *)(puVar4 + -2) = 0xffffffffffffffff;
  uVar5 = *(ulong *)(puVar4 + -2);
  do {
    uVar7 = uVar5 & 0xffffffff;
    for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
      if ((puVar4[uVar8] == 0) && ((int)puVar2[uVar8] < (int)uVar7)) {
        uVar6 = uVar8 & 0xffffffff;
        uVar7 = (ulong)(uint)puVar2[uVar8];
      }
    }
    puVar4[(int)uVar6] = 1;
    for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
      if (puVar4[uVar8] == 0) {
        iVar3 = g.arc[(int)uVar6][uVar8] + (int)uVar7;
        if ((int)puVar2[uVar8] <= iVar3) {
          iVar3 = puVar2[uVar8];
        }
        puVar2[uVar8] = iVar3;
      }
    }
  } while( true );
}

Assistant:

int dijkstra_1(m_graph g, int v) {
        int min, k;
        int ver[g.vnum];
        int dis[g.vnum];
        int flag[g.vnum];
        for (int i = 0; i < g.vnum; i++) {
            dis[i] = g.arc[v][i];
            flag[i] = 0;
            ver[i] = 0;
        }
        flag[0] = 1;//自己一个点不用求
        dis[0] = 0;//自己到自己距离0
        for (int i = 1; i < g.vnum; i++) {
            min = INTMAX_MAX;
            for (int j = 0; j < g.vnum; j++) {
                if (flag[j] == 0 && dis[j] < min) {
                    min = dis[j];
                    k = j;
                }
            }
            flag[k] = 1;
            for (int j = 0; j < g.vnum; j++) {
                if (flag[j] == 0 && min + g.arc[k][j] < dis[j]) {
                    dis[j] = min + g.arc[k][j];
                    ver[j] = k;
                }
            }
        }
    }